

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> * __thiscall
testing::internal::
TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
          (TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
           *this,int n)

{
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *pTVar1;
  Cardinality local_28;
  int local_14;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *pTStack_10;
  int n_local;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  Exactly((testing *)&local_28,n);
  pTVar1 = Times(this,&local_28);
  Cardinality::~Cardinality(&local_28);
  return pTVar1;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }